

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O3

Matrix InputMatrix(istream *f)

{
  istream *this;
  istream *this_00;
  Matrix ppdVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int ncols;
  int nrows;
  char check;
  uint local_34;
  int local_30;
  char local_29;
  
  this = std::operator>>(f,&local_29);
  this_00 = (istream *)std::istream::operator>>((istream *)this,&local_30);
  std::istream::operator>>(this_00,(int *)&local_34);
  if (local_29 == 'M') {
    ppdVar1 = NewMatrix(local_30,local_34);
    if (0 < local_30) {
      uVar2 = (ulong)local_34;
      lVar4 = 0;
      iVar3 = local_30;
      do {
        if (0 < (int)uVar2) {
          lVar5 = 0;
          do {
            std::istream::_M_extract<double>((double *)f);
            lVar5 = lVar5 + 1;
            uVar2 = (ulong)(int)local_34;
            iVar3 = local_30;
          } while (lVar5 < (long)uVar2);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
  }
  else {
    std::ios::clear((int)f + (int)*(undefined8 *)(*(long *)f + -0x18));
    ppdVar1 = (Matrix)0x0;
  }
  return ppdVar1;
}

Assistant:

Matrix
InputMatrix(std::istream &f)
{
  Matrix m;
  int i, j;
  char check;
  int nrows, ncols;

  f >> check >> nrows >> ncols;
  if (check != 'M') {
    f.clear(std::ios::badbit);
    return nullptr;
  }
  m = NewMatrix(nrows, ncols);
  for (i = 0; i < nrows; i++)
    for (j = 0; j < ncols; j++)
      f >> m[i][j];
  return m;
}